

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvocationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InvocationExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ArgumentListSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,ArgumentListSyntax **args_2)

{
  InvocationExpressionSyntax *this_00;
  ArgumentListSyntax **args_local_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local_1;
  ExpressionSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (InvocationExpressionSyntax *)allocate(this,0x50,8);
  slang::syntax::InvocationExpressionSyntax::InvocationExpressionSyntax(this_00,args,args_1,*args_2)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }